

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_prepared_api.cpp
# Opt level: O0

unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
TestExecutePrepared(Connection *con,string *query)

{
  StringRef capturedExpression;
  undefined1 uVar1;
  ExprLhs<bool> EVar2;
  QueryResult *in_RDI;
  AssertionHandler catchAssertionHandler;
  unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
  prepared;
  Decomposer *in_stack_ffffffffffffff28;
  undefined6 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff36;
  undefined1 in_stack_ffffffffffffff37;
  StringRef *in_stack_ffffffffffffff38;
  AssertionHandler *this;
  _Head_base<0UL,_duckdb::QueryResult_*,_false> _Var3;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  AssertionHandler *in_stack_ffffffffffffff60;
  PreparedStatement *in_stack_ffffffffffffff68;
  AssertionHandler local_88;
  string local_20 [32];
  
  _Var3._M_head_impl = in_RDI;
  duckdb::Connection::Prepare(local_20);
  local_88.m_assertionInfo.lineInfo =
       (SourceLineInfo)
       operator____catch_sr
                 ((char *)CONCAT17(in_stack_ffffffffffffff37,
                                   CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)),
                  (size_t)in_stack_ffffffffffffff28);
  this = &local_88;
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)this,
             "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/test/api/test_prepared_api.cpp"
             ,0x196);
  Catch::StringRef::StringRef((StringRef *)this,(char *)in_stack_ffffffffffffff38);
  capturedExpression.m_size = (size_type)_Var3._M_head_impl;
  capturedExpression.m_start = (char *)in_RDI;
  Catch::AssertionHandler::AssertionHandler
            (this,in_stack_ffffffffffffff38,
             (SourceLineInfo *)
             CONCAT17(in_stack_ffffffffffffff37,
                      CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)),
             capturedExpression,(Flags)((ulong)in_stack_ffffffffffffff28 >> 0x20));
  duckdb::
  unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>::
  operator->((unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
              *)CONCAT17(in_stack_ffffffffffffff37,
                         CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)));
  uVar1 = duckdb::PreparedStatement::HasError();
  EVar2 = Catch::Decomposer::operator<=(in_stack_ffffffffffffff28,false);
  Catch::AssertionHandler::handleExpr<bool>
            (in_stack_ffffffffffffff60,
             (ExprLhs<bool> *)
             CONCAT44(in_stack_ffffffffffffff5c,
                      CONCAT13(EVar2.m_lhs,(int3)in_stack_ffffffffffffff58)));
  Catch::AssertionHandler::complete
            ((AssertionHandler *)CONCAT17(uVar1,CONCAT16(EVar2.m_lhs,in_stack_ffffffffffffff30)));
  Catch::AssertionHandler::~AssertionHandler
            ((AssertionHandler *)CONCAT17(uVar1,CONCAT16(EVar2.m_lhs,in_stack_ffffffffffffff30)));
  duckdb::
  unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>::
  operator->((unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
              *)CONCAT17(uVar1,CONCAT16(EVar2.m_lhs,in_stack_ffffffffffffff30)));
  duckdb::PreparedStatement::Execute<>(in_stack_ffffffffffffff68);
  duckdb::
  unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>::
  ~unique_ptr((unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
               *)0x58ba01);
  return (unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>)
         (_Tuple_impl<0UL,_duckdb::QueryResult_*,_std::default_delete<duckdb::QueryResult>_>)
         _Var3._M_head_impl;
}

Assistant:

static duckdb::unique_ptr<QueryResult> TestExecutePrepared(Connection &con, string query) {
	auto prepared = con.Prepare(query);
	REQUIRE(!prepared->HasError());
	return prepared->Execute();
}